

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outqueue.c
# Opt level: O0

lzma_ret lzma_outq_read(lzma_outq *outq,uint8_t *out,size_t *out_pos,size_t out_size,
                       lzma_vli *unpadded_size,lzma_vli *uncompressed_size)

{
  lzma_outbuf *plVar1;
  lzma_outbuf *buf;
  uint32_t i;
  lzma_vli *uncompressed_size_local;
  lzma_vli *unpadded_size_local;
  size_t out_size_local;
  size_t *out_pos_local;
  uint8_t *out_local;
  lzma_outq *outq_local;
  
  if (outq->bufs_used == 0) {
    outq_local._4_4_ = LZMA_OK;
  }
  else {
    buf._4_4_ = outq->bufs_pos - outq->bufs_used;
    if (outq->bufs_pos < outq->bufs_used) {
      buf._4_4_ = outq->bufs_allocated + buf._4_4_;
    }
    plVar1 = outq->bufs + buf._4_4_;
    if ((plVar1->finished & 1U) == 0) {
      outq_local._4_4_ = LZMA_OK;
    }
    else {
      lzma_bufcpy(plVar1->buf,&outq->read_pos,plVar1->size,out,out_pos,out_size);
      if (outq->read_pos < plVar1->size) {
        outq_local._4_4_ = LZMA_OK;
      }
      else {
        *unpadded_size = plVar1->unpadded_size;
        *uncompressed_size = plVar1->uncompressed_size;
        outq->bufs_used = outq->bufs_used - 1;
        outq->read_pos = 0;
        outq_local._4_4_ = LZMA_STREAM_END;
      }
    }
  }
  return outq_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_outq_read(lzma_outq *restrict outq, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size,
		lzma_vli *restrict unpadded_size,
		lzma_vli *restrict uncompressed_size)
{
	// There must be at least one buffer from which to read.
	if (outq->bufs_used == 0)
		return LZMA_OK;

	// Get the buffer.
	uint32_t i = outq->bufs_pos - outq->bufs_used;
	if (outq->bufs_pos < outq->bufs_used)
		i += outq->bufs_allocated;

	lzma_outbuf *buf = &outq->bufs[i];

	// If it isn't finished yet, we cannot read from it.
	if (!buf->finished)
		return LZMA_OK;

	// Copy from the buffer to output.
	lzma_bufcpy(buf->buf, &outq->read_pos, buf->size,
			out, out_pos, out_size);

	// Return if we didn't get all the data from the buffer.
	if (outq->read_pos < buf->size)
		return LZMA_OK;

	// The buffer was finished. Tell the caller its size information.
	*unpadded_size = buf->unpadded_size;
	*uncompressed_size = buf->uncompressed_size;

	// Free this buffer for further use.
	--outq->bufs_used;
	outq->read_pos = 0;

	return LZMA_STREAM_END;
}